

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void cppcms::json::traits<char[12]>::set(value *v,vtype *in)

{
  size_t sVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  sVar1 = strlen(*in);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,in,*in + sVar1);
  cppcms::json::value::str((string *)v);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

static void set(value &v,vtype const &in)
		{					
			v.str(in);
		}